

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

void __thiscall
spvtools::opt::InstructionBuilder::InstructionBuilder
          (InstructionBuilder *this,IRContext *context,Instruction *insert_before,
          Analysis preserved_analyses)

{
  BasicBlock *parent;
  iterator local_30;
  Analysis local_24;
  Instruction *pIStack_20;
  Analysis preserved_analyses_local;
  Instruction *insert_before_local;
  IRContext *context_local;
  InstructionBuilder *this_local;
  
  local_24 = preserved_analyses;
  pIStack_20 = insert_before;
  insert_before_local = (Instruction *)context;
  context_local = (IRContext *)this;
  parent = IRContext::get_instr_block(context,insert_before);
  InstructionList::iterator::iterator(&local_30,pIStack_20);
  InstructionBuilder(this,context,parent,&local_30,local_24);
  return;
}

Assistant:

InstructionBuilder(
      IRContext* context, Instruction* insert_before,
      IRContext::Analysis preserved_analyses = IRContext::kAnalysisNone)
      : InstructionBuilder(context, context->get_instr_block(insert_before),
                           InsertionPointTy(insert_before),
                           preserved_analyses) {}